

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  bool bVar1;
  AlphaNum *in_R8;
  string_view existing_type;
  string_view this_type;
  string name_suffix;
  string_view local_d8 [3];
  string local_a8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  existing_type._M_str = "default";
  this_type._M_str = "default";
  if ((ulong)*(byte *)(*(long *)this + 0x28) != 0) {
    this_type._M_str = "custom";
  }
  this_type._M_len = (ulong)*(byte *)(*(long *)this + 0x28) ^ 7;
  if ((ulong)*(byte *)(*(long *)(this + 8) + 0x28) != 0) {
    existing_type._M_str = "custom";
  }
  existing_type._M_len = (ulong)*(byte *)(*(long *)(this + 8) + 0x28) ^ 7;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_suffix,"",(allocator<char> *)local_d8);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)this + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)(this + 8) + 8));
  if (bVar1) {
    local_d8[0] = NullSafeStringView(" (\"");
    local_58.piece_._M_str = *(char **)(*(long *)(this + 8) + 8);
    local_58.piece_._M_len = *(size_t *)(*(long *)(this + 8) + 0x10);
    local_88.piece_ = NullSafeStringView("\")");
    StrCat_abi_cxx11_(&local_a8,(lts_20250127 *)local_d8,&local_58,&local_88,in_R8);
    std::__cxx11::string::operator=((string *)&name_suffix,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  local_d8[0]._M_str = (char *)0x56;
  local_d8[0]._M_len =
       (size_t)
       "The %s JSON name of field \"%s\" (\"%s\") conflicts with the %s JSON name of field \"%s\"%s."
  ;
  StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (__return_storage_ptr__,
             (FormatSpec<std::basic_string_view<char>,_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>,_std::basic_string_view<char>,_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>
              *)local_d8,&this_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(ulong *)(*(long *)(this + 0x10) + 0x18) & 0xfffffffffffffffc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)this + 8),&existing_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(ulong *)(**(long **)(this + 8) + 0x18) & 0xfffffffffffffffc),&name_suffix);
  std::__cxx11::string::~string((string *)&name_suffix);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}